

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O0

shared_ptr<helics::Broker> __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::findObject
          (SearchableObjectHolder<helics::Core,_helics::CoreType> *this,
          function<bool_(const_std::shared_ptr<helics::Broker>_&)> *operand,CoreType type)

{
  anon_class_24_3_8708baee_for__M_pred __pred;
  bool bVar1;
  iterator iVar2;
  undefined4 in_ECX;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<helics::Broker> *in_RSI;
  element_type *in_RDI;
  shared_ptr<helics::Broker> sVar3;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>
  obj;
  lock_guard<std::mutex> lock;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>_>
  *in_stack_ffffffffffffff38;
  lock_guard<std::mutex> *in_stack_ffffffffffffff40;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>
  in_stack_ffffffffffffff90;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>
  in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffbc;
  _Self local_30 [2];
  undefined4 local_1c;
  
  local_1c = in_ECX;
  CLI::std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffff40,(mutex_type *)in_stack_ffffffffffffff38);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>_>
  ::begin(in_stack_ffffffffffffff38);
  iVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>_>
          ::end(in_stack_ffffffffffffff38);
  __pred.this._0_4_ = local_1c;
  __pred.operand = (function<bool_(const_std::shared_ptr<helics::Core>_&)> *)in_RSI;
  __pred.this._4_4_ = in_stack_ffffffffffffffbc;
  __pred._16_8_ = iVar2._M_node;
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       find_if<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Broker>>>,gmlc::concurrency::SearchableObjectHolder<helics::Broker,helics::CoreType>::findObject(std::function<bool(std::shared_ptr<helics::Broker>const&)>,helics::CoreType)::_lambda(auto:1&)_1_>
                 (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,__pred);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>_>
  ::end(in_RDX);
  bVar1 = std::operator==(local_30,(_Self *)&stack0xffffffffffffff90);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    CLI::std::shared_ptr<helics::Broker>::shared_ptr(in_RSI,in_RDX);
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>
                  *)0x4fa3ee);
    std::shared_ptr<helics::Broker>::shared_ptr(in_RSI,(shared_ptr<helics::Broker> *)in_RDX);
  }
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x4fa449);
  sVar3.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<helics::Broker>)
         sVar3.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<X>
        findObject(std::function<bool(const std::shared_ptr<X>&)> operand,
                   Y type)
    {
        std::lock_guard<std::mutex> lock(mapLock);
        auto obj = std::find_if(objectMap.begin(),
                                objectMap.end(),
                                [&operand, this, type](auto& val) {
                                    if (operand(val.second)) {
                                        auto tfind = typeMap.find(val.first);
                                        if (tfind != typeMap.end()) {
                                            for (auto& t : tfind->second) {
                                                if (t == type) {
                                                    return true;
                                                }
                                            }
                                        }
                                    }
                                    return false;
                                });
        if (obj != objectMap.end()) {
            return obj->second;
        }
        return nullptr;
    }